

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O0

int SHA512FinalBits(SHA512Context *context,uint8_t message_bits,uint length)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  bool bVar4;
  byte local_38 [8];
  uint8_t markbit [8];
  uint8_t masks [8];
  uint64_t addTemp;
  uint length_local;
  uint8_t message_bits_local;
  SHA512Context *context_local;
  
  markbit[0] = '\0';
  markbit[1] = 0x80;
  markbit[2] = 0xc0;
  markbit[3] = 0xe0;
  markbit[4] = 0xf0;
  markbit[5] = 0xf8;
  markbit[6] = 0xfc;
  markbit[7] = 0xfe;
  local_38[0] = 0x80;
  local_38[1] = 0x40;
  local_38[2] = 0x20;
  local_38[3] = 0x10;
  local_38[4] = 8;
  local_38[5] = 4;
  local_38[6] = 2;
  local_38[7] = 1;
  if (length == 0) {
    context_local._4_4_ = 0;
  }
  else if (context == (SHA512Context *)0x0) {
    context_local._4_4_ = 1;
  }
  else if (((context->Computed == 0) && (length < 8)) && (length != 0)) {
    if (context->Corrupted == 0) {
      uVar1 = context->Length_Low;
      uVar3 = (ulong)length + context->Length_Low;
      context->Length_Low = uVar3;
      bVar4 = false;
      if (uVar3 < uVar1) {
        uVar2 = context->Length_High + 1;
        context->Length_High = uVar2;
        bVar4 = uVar2 == 0;
      }
      context->Corrupted = (uint)bVar4;
      SHA384_512Finalize(context,message_bits & markbit[length] | markbit[(ulong)length - 8]);
      context_local._4_4_ = 0;
    }
    else {
      context_local._4_4_ = context->Corrupted;
    }
  }
  else {
    context->Corrupted = 3;
    context_local._4_4_ = 3;
  }
  return context_local._4_4_;
}

Assistant:

int SHA512FinalBits(SHA512Context *context,
    const uint8_t message_bits, unsigned int length)
{
    uint64_t addTemp;
    uint8_t masks[8] = {
        /* 0 0b00000000 */ 0x00, /* 1 0b10000000 */ 0x80,
        /* 2 0b11000000 */ 0xC0, /* 3 0b11100000 */ 0xE0,
        /* 4 0b11110000 */ 0xF0, /* 5 0b11111000 */ 0xF8,
        /* 6 0b11111100 */ 0xFC, /* 7 0b11111110 */ 0xFE
    };
    uint8_t markbit[8] = {
        /* 0 0b10000000 */ 0x80, /* 1 0b01000000 */ 0x40,
        /* 2 0b00100000 */ 0x20, /* 3 0b00010000 */ 0x10,
        /* 4 0b00001000 */ 0x08, /* 5 0b00000100 */ 0x04,
        /* 6 0b00000010 */ 0x02, /* 7 0b00000001 */ 0x01
    };

    if (!length)
        return shaSuccess;

    if (!context)
        return shaNull;

    if ((context->Computed) || (length >= 8) || (length == 0)) {
        context->Corrupted = shaStateError;
        return shaStateError;
    }

    if (context->Corrupted)
        return context->Corrupted;

    SHA384_512AddLength(context, length);
    SHA384_512Finalize(context, (uint8_t)
        ((message_bits & masks[length]) | markbit[length]));

    return shaSuccess;
}